

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void * PoolAllocator_malloc_free<false>::malloc(size_t __size)

{
  void *pvVar1;
  void *ret;
  
  pvVar1 = ::malloc(__size);
  return pvVar1;
}

Assistant:

static char * malloc(const size_type nbytes)
  { void *ret;

#ifdef DEPSPAWN_USE_TBB
    if(SCALABLE)
      ret = scalable_malloc(nbytes);
    else
#endif
      ret = std::malloc(nbytes);
    return static_cast<char *>(ret);
  }